

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O0

void __thiscall CVmObjStrComp::load_from_stream(CVmObjStrComp *this,CVmStream *str)

{
  long *in_RSI;
  CVmStream *in_RDI;
  CVmObjStrCompMapReaderStream reader;
  uint total_chars;
  uint equiv_cnt;
  uint flags;
  uint trunc_len;
  size_t in_stack_00000038;
  int in_stack_00000044;
  size_t in_stack_00000048;
  CVmObjStrComp *in_stack_00000050;
  CVmObjStrCompMapReaderStream *in_stack_ffffffffffffffd0;
  
  (**(code **)(*in_RSI + 0x30))();
  (**(code **)(*in_RSI + 0x30))();
  (**(code **)(*in_RSI + 0x30))();
  (**(code **)(*in_RSI + 0x30))();
  CVmObjStrCompMapReaderStream::CVmObjStrCompMapReaderStream(in_stack_ffffffffffffffd0,in_RDI);
  alloc_ext(in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000038,(size_t)this,
            (CVmObjStrCompMapReader *)str);
  return;
}

Assistant:

void CVmObjStrComp::load_from_stream(VMG_ CVmStream *str)
{
    unsigned int trunc_len;
    unsigned int flags;
    unsigned int equiv_cnt;
    unsigned int total_chars;
    
    /* load the fixed header */
    trunc_len = str->read_uint2();
    flags = str->read_uint2();
    equiv_cnt = str->read_uint2();
    total_chars = str->read_uint2();

    /* set up a stream-based mapping reader */
    CVmObjStrCompMapReaderStream reader(str);

    /* allocate and initialize our extension */
    alloc_ext(vmg_ trunc_len, (flags & 0x0001) != 0, equiv_cnt, total_chars,
              &reader);
}